

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLElement::Attribute(XMLElement *this,char *name,char *value)

{
  long lVar1;
  XMLAttribute *pXVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  pXVar2 = FindAttribute(this,name);
  if (pXVar2 == (XMLAttribute *)0x0) {
    return (char *)0x0;
  }
  if ((value != (char *)0x0) && (pcVar3 = StrPair::GetStr(&pXVar2->_value), pcVar3 != value)) {
    bVar5 = *pcVar3 == '\0';
    if ((bVar5) || (*pcVar3 != *value)) {
      bVar6 = false;
    }
    else {
      lVar1 = 1;
      do {
        lVar4 = lVar1;
        bVar5 = pcVar3[lVar4] == '\0';
        if ((bVar5) || (pcVar3[lVar4] != value[lVar4])) break;
        lVar1 = lVar4 + 1;
      } while ((int)lVar4 != 0x7fffffff);
      bVar6 = (int)lVar4 == 0x7fffffff;
      value = value + lVar4;
    }
    if (!bVar6) {
      if (!bVar5) {
        return (char *)0x0;
      }
      if (*value != '\0') {
        return (char *)0x0;
      }
    }
  }
  pcVar3 = StrPair::GetStr(&pXVar2->_value);
  return pcVar3;
}

Assistant:

const char* XMLElement::Attribute( const char* name, const char* value ) const
{
    const XMLAttribute* a = FindAttribute( name );
    if ( !a ) {
        return 0;
    }
    if ( !value || XMLUtil::StringEqual( a->Value(), value )) {
        return a->Value();
    }
    return 0;
}